

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O3

void __thiscall Future<void>::Private::ThreadPool::~ThreadPool(ThreadPool *this)

{
  usize *puVar1;
  Item *pIVar2;
  usize uVar3;
  ulong uVar4;
  Node *pNVar5;
  ulong uVar7;
  void *__stat_loc;
  Item *pIVar8;
  bool bVar9;
  Job job;
  undefined8 *puVar6;
  
  pIVar2 = (this->_threads)._end.item;
  pIVar8 = (this->_threads)._begin.item;
  if (pIVar8 != pIVar2) {
LAB_0011212a:
    uVar7 = (this->_queue)._tail;
    do {
      uVar4 = uVar7;
      pNVar5 = (this->_queue)._queue;
      uVar7 = (this->_queue)._capacityMask & uVar4;
      __stat_loc = (void *)(uVar7 * 0x20);
      if (pNVar5[uVar7].tail != uVar4) {
        LOCK();
        puVar1 = &(this->_dequeuedSignal)._state;
        uVar3 = *puVar1;
        *puVar1 = 0;
        UNLOCK();
        if (uVar3 == 1) {
          Signal::reset(&(this->_dequeuedSignal)._signal);
        }
        uVar7 = (this->_queue)._tail;
        goto LAB_00112176;
      }
      puVar1 = &(this->_queue)._tail;
      LOCK();
      uVar7 = *puVar1;
      bVar9 = uVar4 == uVar7;
      if (bVar9) {
        *puVar1 = uVar4 + 1;
        uVar7 = uVar4;
      }
      UNLOCK();
    } while (!bVar9);
    goto LAB_001121a1;
  }
LAB_001120ba:
  PoolList<Future<void>::Private::ThreadPool::ThreadContext>::~PoolList(&this->_threads);
  Mutex::~Mutex(&this->_mutex);
  Signal::~Signal(&(this->_enqueuedSignal)._signal);
  Signal::~Signal(&(this->_dequeuedSignal)._signal);
  uVar3 = (this->_queue)._head - 1;
  do {
    uVar3 = uVar3 + 1;
  } while (uVar3 != (this->_queue)._tail);
  pNVar5 = (this->_queue)._queue;
  if (pNVar5 == (Node *)0x0) {
    return;
  }
  operator_delete__(pNVar5);
  return;
  while( true ) {
    puVar1 = &(this->_queue)._tail;
    LOCK();
    uVar7 = *puVar1;
    bVar9 = uVar4 == uVar7;
    if (bVar9) {
      *puVar1 = uVar4 + 1;
      uVar7 = uVar4;
    }
    UNLOCK();
    if (bVar9) break;
LAB_00112176:
    uVar4 = uVar7;
    pNVar5 = (this->_queue)._queue;
    uVar7 = (this->_queue)._capacityMask & uVar4;
    __stat_loc = (void *)(uVar7 * 0x20);
    if (pNVar5[uVar7].tail != uVar4) {
      if ((this->_dequeuedSignal)._state == 0) {
        Signal::wait(&(this->_dequeuedSignal)._signal,__stat_loc);
      }
      goto LAB_0011212a;
    }
  }
LAB_001121a1:
  puVar6 = (undefined8 *)((long)&(pNVar5->data).proc + (long)__stat_loc);
  *puVar6 = 0;
  puVar6[1] = 0;
  LOCK();
  puVar6[3] = uVar4;
  UNLOCK();
  LOCK();
  puVar1 = &(this->_enqueuedSignal)._state;
  uVar3 = *puVar1;
  *puVar1 = 1;
  UNLOCK();
  if (uVar3 == 0) {
    Signal::set(&(this->_enqueuedSignal)._signal);
  }
  pIVar8 = pIVar8->next;
  if (pIVar8 == pIVar2) goto LAB_001121f5;
  goto LAB_0011212a;
LAB_001121f5:
  pIVar2 = (this->_threads)._end.item;
  for (pIVar8 = (this->_threads)._begin.item; pIVar8 != pIVar2; pIVar8 = pIVar8->next) {
    Thread::join((Thread *)(pIVar8 + 1));
  }
  goto LAB_001120ba;
}

Assistant:

~ThreadPool()
    {
      Job job = {0, 0};
      for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end; ++i)
      {
        while (!_queue.push(job))
        {
          _dequeuedSignal.reset();
          if (_queue.push(job))
            break;
          _dequeuedSignal.wait();
        }
        _enqueuedSignal.set();
      }
      for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end; ++i)
        i->_thread.join();
    }